

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

void __thiscall Epoll::epoll_mod(Epoll *this,SP_Channel *request,int timeout)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  __uint32_t *p_Var4;
  int in_EDX;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  epoll_event event;
  int fd;
  int in_stack_00000fc4;
  shared_ptr<Channel> *in_stack_00000fc8;
  Epoll *in_stack_00000fd0;
  shared_ptr<Channel> *in_stack_ffffffffffffff98;
  epoll_event local_44;
  shared_ptr<Channel> local_28 [2];
  
  if (0 < in_EDX) {
    std::shared_ptr<Channel>::shared_ptr(local_28,in_stack_ffffffffffffff98);
    add_time(in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc4);
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)0x1065bb);
  }
  peVar3 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1065e4);
  local_44.data.u64._4_4_ = Channel::getFd(peVar3);
  peVar3 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1065fa);
  bVar1 = Channel::EqualAndUpdateLastEvents(peVar3);
  if (!bVar1) {
    local_44._4_4_ = local_44.data.u64._4_4_;
    peVar3 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x106618);
    p_Var4 = Channel::getEvents(peVar3);
    local_44.events = *p_Var4;
    iVar2 = epoll_ctl(*(int *)&in_RDI->_M_ptr,3,local_44.data.u64._4_4_,&local_44);
    if (iVar2 < 0) {
      perror("epoll_mod error");
      std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::reset(in_RDI);
    }
  }
  return;
}

Assistant:

void Epoll::epoll_mod(SP_Channel request, int timeout){
    if(timeout > 0) add_time(request, timeout);
    int fd=request->getFd();
    if(!request->EqualAndUpdateLastEvents()){
        struct epoll_event event;
        event.data.fd=fd;
        event.events=request->getEvents();
        if(epoll_ctl(epollFd_, EPOLL_CTL_MOD, fd, &event)<0){
            perror("epoll_mod error");
            fd2chan_[fd].reset();
        }
    }
}